

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.h
# Opt level: O1

void __thiscall
psy::C::SemanticModelTester::SemanticModelTester(SemanticModelTester *this,TestSuite *suite)

{
  code **ppcVar1;
  long lVar2;
  initializer_list<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>
  __l;
  allocator_type local_2a71 [9];
  code *local_2a68 [2];
  code *local_2a58;
  code *pcStack_2a50;
  char *local_2a48;
  code *local_2a40;
  undefined8 uStack_2a38;
  code *local_2a30;
  code *pcStack_2a28;
  char *local_2a20;
  code *local_2a18;
  undefined8 uStack_2a10;
  code *local_2a08;
  code *pcStack_2a00;
  char *local_29f8;
  code *local_29f0;
  undefined8 uStack_29e8;
  code *local_29e0;
  code *pcStack_29d8;
  char *local_29d0;
  code *local_29c8;
  undefined8 uStack_29c0;
  code *local_29b8;
  code *pcStack_29b0;
  char *local_29a8;
  code *local_29a0;
  undefined8 uStack_2998;
  code *local_2990;
  code *pcStack_2988;
  char *local_2980;
  code *local_2978;
  undefined8 uStack_2970;
  code *local_2968;
  code *pcStack_2960;
  char *local_2958;
  code *local_2950;
  undefined8 uStack_2948;
  code *local_2940;
  code *pcStack_2938;
  char *local_2930;
  code *local_2928;
  undefined8 uStack_2920;
  code *local_2918;
  code *pcStack_2910;
  char *local_2908;
  code *local_2900;
  undefined8 uStack_28f8;
  code *local_28f0;
  code *pcStack_28e8;
  char *local_28e0;
  code *local_28d8;
  undefined8 uStack_28d0;
  code *local_28c8;
  code *pcStack_28c0;
  char *local_28b8;
  code *local_28b0;
  undefined8 uStack_28a8;
  code *local_28a0;
  code *pcStack_2898;
  char *local_2890;
  code *local_2888;
  undefined8 uStack_2880;
  code *local_2878;
  code *pcStack_2870;
  char *local_2868;
  code *local_2860;
  undefined8 uStack_2858;
  code *local_2850;
  code *pcStack_2848;
  char *local_2840;
  code *local_2838;
  undefined8 uStack_2830;
  code *local_2828;
  code *pcStack_2820;
  char *local_2818;
  code *local_2810;
  undefined8 uStack_2808;
  code *local_2800;
  code *pcStack_27f8;
  char *local_27f0;
  code *local_27e8;
  undefined8 uStack_27e0;
  code *local_27d8;
  code *pcStack_27d0;
  char *local_27c8;
  code *local_27c0;
  undefined8 uStack_27b8;
  code *local_27b0;
  code *pcStack_27a8;
  char *local_27a0;
  code *local_2798;
  undefined8 uStack_2790;
  code *local_2788;
  code *pcStack_2780;
  char *local_2778;
  code *local_2770;
  undefined8 uStack_2768;
  code *local_2760;
  code *pcStack_2758;
  char *local_2750;
  code *local_2748;
  undefined8 uStack_2740;
  code *local_2738;
  code *pcStack_2730;
  char *local_2728;
  code *local_2720;
  undefined8 uStack_2718;
  code *local_2710;
  code *pcStack_2708;
  char *local_2700;
  code *local_26f8;
  undefined8 uStack_26f0;
  code *local_26e8;
  code *pcStack_26e0;
  char *local_26d8;
  code *local_26d0;
  undefined8 uStack_26c8;
  code *local_26c0;
  code *pcStack_26b8;
  char *local_26b0;
  code *local_26a8;
  undefined8 uStack_26a0;
  code *local_2698;
  code *pcStack_2690;
  char *local_2688;
  code *local_2680;
  undefined8 uStack_2678;
  code *local_2670;
  code *pcStack_2668;
  char *local_2660;
  code *local_2658;
  undefined8 uStack_2650;
  code *local_2648;
  code *pcStack_2640;
  char *local_2638;
  code *local_2630;
  undefined8 uStack_2628;
  code *local_2620;
  code *pcStack_2618;
  char *local_2610;
  code *local_2608;
  undefined8 uStack_2600;
  code *local_25f8;
  code *pcStack_25f0;
  char *local_25e8;
  code *local_25e0;
  undefined8 uStack_25d8;
  code *local_25d0;
  code *pcStack_25c8;
  char *local_25c0;
  code *local_25b8;
  undefined8 uStack_25b0;
  code *local_25a8;
  code *pcStack_25a0;
  char *local_2598;
  code *local_2590;
  undefined8 uStack_2588;
  code *local_2580;
  code *pcStack_2578;
  char *local_2570;
  code *local_2568;
  undefined8 uStack_2560;
  code *local_2558;
  code *pcStack_2550;
  char *local_2548;
  code *local_2540;
  undefined8 uStack_2538;
  code *local_2530;
  code *pcStack_2528;
  char *local_2520;
  code *local_2518;
  undefined8 uStack_2510;
  code *local_2508;
  code *pcStack_2500;
  char *local_24f8;
  code *local_24f0;
  undefined8 uStack_24e8;
  code *local_24e0;
  code *pcStack_24d8;
  char *local_24d0;
  code *local_24c8;
  undefined8 uStack_24c0;
  code *local_24b8;
  code *pcStack_24b0;
  char *local_24a8;
  code *local_24a0;
  undefined8 uStack_2498;
  code *local_2490;
  code *pcStack_2488;
  char *local_2480;
  code *local_2478;
  undefined8 uStack_2470;
  code *local_2468;
  code *pcStack_2460;
  char *local_2458;
  code *local_2450;
  undefined8 uStack_2448;
  code *local_2440;
  code *pcStack_2438;
  char *local_2430;
  code *local_2428;
  undefined8 uStack_2420;
  code *local_2418;
  code *pcStack_2410;
  char *local_2408;
  code *local_2400;
  undefined8 uStack_23f8;
  code *local_23f0;
  code *pcStack_23e8;
  char *local_23e0;
  code *local_23d8;
  undefined8 uStack_23d0;
  code *local_23c8;
  code *pcStack_23c0;
  char *local_23b8;
  code *local_23b0;
  undefined8 uStack_23a8;
  code *local_23a0;
  code *pcStack_2398;
  char *local_2390;
  code *local_2388;
  undefined8 uStack_2380;
  code *local_2378;
  code *pcStack_2370;
  char *local_2368;
  code *local_2360;
  undefined8 uStack_2358;
  code *local_2350;
  code *pcStack_2348;
  char *local_2340;
  code *local_2338;
  undefined8 uStack_2330;
  code *local_2328;
  code *pcStack_2320;
  char *local_2318;
  code *local_2310;
  undefined8 uStack_2308;
  code *local_2300;
  code *pcStack_22f8;
  char *local_22f0;
  code *local_22e8;
  undefined8 uStack_22e0;
  code *local_22d8;
  code *pcStack_22d0;
  char *local_22c8;
  code *local_22c0;
  undefined8 uStack_22b8;
  code *local_22b0;
  code *pcStack_22a8;
  char *local_22a0;
  code *local_2298;
  undefined8 uStack_2290;
  code *local_2288;
  code *pcStack_2280;
  char *local_2278;
  code *local_2270;
  undefined8 uStack_2268;
  code *local_2260;
  code *pcStack_2258;
  char *local_2250;
  code *local_2248;
  undefined8 uStack_2240;
  code *local_2238;
  code *pcStack_2230;
  char *local_2228;
  code *local_2220;
  undefined8 uStack_2218;
  code *local_2210;
  code *pcStack_2208;
  char *local_2200;
  code *local_21f8;
  undefined8 uStack_21f0;
  code *local_21e8;
  code *pcStack_21e0;
  char *local_21d8;
  code *local_21d0;
  undefined8 uStack_21c8;
  code *local_21c0;
  code *pcStack_21b8;
  char *local_21b0;
  code *local_21a8;
  undefined8 uStack_21a0;
  code *local_2198;
  code *pcStack_2190;
  char *local_2188;
  code *local_2180;
  undefined8 uStack_2178;
  code *local_2170;
  code *pcStack_2168;
  char *local_2160;
  code *local_2158;
  undefined8 uStack_2150;
  code *local_2148;
  code *pcStack_2140;
  char *local_2138;
  code *local_2130;
  undefined8 uStack_2128;
  code *local_2120;
  code *pcStack_2118;
  char *local_2110;
  code *local_2108;
  undefined8 uStack_2100;
  code *local_20f8;
  code *pcStack_20f0;
  char *local_20e8;
  code *local_20e0;
  undefined8 uStack_20d8;
  code *local_20d0;
  code *pcStack_20c8;
  char *local_20c0;
  code *local_20b8;
  undefined8 uStack_20b0;
  code *local_20a8;
  code *pcStack_20a0;
  char *local_2098;
  code *local_2090;
  undefined8 uStack_2088;
  code *local_2080;
  code *pcStack_2078;
  char *local_2070;
  code *local_2068;
  undefined8 uStack_2060;
  code *local_2058;
  code *pcStack_2050;
  char *local_2048;
  code *local_2040;
  undefined8 uStack_2038;
  code *local_2030;
  code *pcStack_2028;
  char *local_2020;
  code *local_2018;
  undefined8 uStack_2010;
  code *local_2008;
  code *pcStack_2000;
  char *local_1ff8;
  code *local_1ff0;
  undefined8 uStack_1fe8;
  code *local_1fe0;
  code *pcStack_1fd8;
  char *local_1fd0;
  code *local_1fc8;
  undefined8 uStack_1fc0;
  code *local_1fb8;
  code *pcStack_1fb0;
  char *local_1fa8;
  code *local_1fa0;
  undefined8 uStack_1f98;
  code *local_1f90;
  code *pcStack_1f88;
  char *local_1f80;
  code *local_1f78;
  undefined8 uStack_1f70;
  code *local_1f68;
  code *pcStack_1f60;
  char *local_1f58;
  code *local_1f50;
  undefined8 uStack_1f48;
  code *local_1f40;
  code *pcStack_1f38;
  char *local_1f30;
  code *local_1f28;
  undefined8 uStack_1f20;
  code *local_1f18;
  code *pcStack_1f10;
  char *local_1f08;
  code *local_1f00;
  undefined8 uStack_1ef8;
  code *local_1ef0;
  code *pcStack_1ee8;
  char *local_1ee0;
  code *local_1ed8;
  undefined8 uStack_1ed0;
  code *local_1ec8;
  code *pcStack_1ec0;
  char *local_1eb8;
  code *local_1eb0;
  undefined8 uStack_1ea8;
  code *local_1ea0;
  code *pcStack_1e98;
  char *local_1e90;
  code *local_1e88;
  undefined8 uStack_1e80;
  code *local_1e78;
  code *pcStack_1e70;
  char *local_1e68;
  code *local_1e60;
  undefined8 uStack_1e58;
  code *local_1e50;
  code *pcStack_1e48;
  char *local_1e40;
  code *local_1e38;
  undefined8 uStack_1e30;
  code *local_1e28;
  code *pcStack_1e20;
  char *local_1e18;
  code *local_1e10;
  undefined8 uStack_1e08;
  code *local_1e00;
  code *pcStack_1df8;
  char *local_1df0;
  code *local_1de8;
  undefined8 uStack_1de0;
  code *local_1dd8;
  code *pcStack_1dd0;
  char *local_1dc8;
  code *local_1dc0;
  undefined8 uStack_1db8;
  code *local_1db0;
  code *pcStack_1da8;
  char *local_1da0;
  code *local_1d98;
  undefined8 uStack_1d90;
  code *local_1d88;
  code *pcStack_1d80;
  char *local_1d78;
  code *local_1d70;
  undefined8 uStack_1d68;
  code *local_1d60;
  code *pcStack_1d58;
  char *local_1d50;
  code *local_1d48;
  undefined8 uStack_1d40;
  code *local_1d38;
  code *pcStack_1d30;
  char *local_1d28;
  code *local_1d20;
  undefined8 uStack_1d18;
  code *local_1d10;
  code *pcStack_1d08;
  char *local_1d00;
  code *local_1cf8;
  undefined8 uStack_1cf0;
  code *local_1ce8;
  code *pcStack_1ce0;
  char *local_1cd8;
  code *local_1cd0;
  undefined8 uStack_1cc8;
  code *local_1cc0;
  code *pcStack_1cb8;
  char *local_1cb0;
  code *local_1ca8;
  undefined8 uStack_1ca0;
  code *local_1c98;
  code *pcStack_1c90;
  char *local_1c88;
  code *local_1c80;
  undefined8 uStack_1c78;
  code *local_1c70;
  code *pcStack_1c68;
  char *local_1c60;
  code *local_1c58;
  undefined8 uStack_1c50;
  code *local_1c48;
  code *pcStack_1c40;
  char *local_1c38;
  code *local_1c30;
  undefined8 uStack_1c28;
  code *local_1c20;
  code *pcStack_1c18;
  char *local_1c10;
  code *local_1c08;
  undefined8 uStack_1c00;
  code *local_1bf8;
  code *pcStack_1bf0;
  char *local_1be8;
  code *local_1be0;
  undefined8 uStack_1bd8;
  code *local_1bd0;
  code *pcStack_1bc8;
  char *local_1bc0;
  code *local_1bb8;
  undefined8 uStack_1bb0;
  code *local_1ba8;
  code *pcStack_1ba0;
  char *local_1b98;
  code *local_1b90;
  undefined8 uStack_1b88;
  code *local_1b80;
  code *pcStack_1b78;
  char *local_1b70;
  code *local_1b68;
  undefined8 uStack_1b60;
  code *local_1b58;
  code *pcStack_1b50;
  char *local_1b48;
  code *local_1b40;
  undefined8 uStack_1b38;
  code *local_1b30;
  code *pcStack_1b28;
  char *local_1b20;
  code *local_1b18;
  undefined8 uStack_1b10;
  code *local_1b08;
  code *pcStack_1b00;
  char *local_1af8;
  code *local_1af0;
  undefined8 uStack_1ae8;
  code *local_1ae0;
  code *pcStack_1ad8;
  char *local_1ad0;
  code *local_1ac8;
  undefined8 uStack_1ac0;
  code *local_1ab8;
  code *pcStack_1ab0;
  char *local_1aa8;
  code *local_1aa0;
  undefined8 uStack_1a98;
  code *local_1a90;
  code *pcStack_1a88;
  char *local_1a80;
  code *local_1a78;
  undefined8 uStack_1a70;
  code *local_1a68;
  code *pcStack_1a60;
  char *local_1a58;
  code *local_1a50;
  undefined8 uStack_1a48;
  code *local_1a40;
  code *pcStack_1a38;
  char *local_1a30;
  code *local_1a28;
  undefined8 uStack_1a20;
  code *local_1a18;
  code *pcStack_1a10;
  char *local_1a08;
  code *local_1a00;
  undefined8 uStack_19f8;
  code *local_19f0;
  code *pcStack_19e8;
  char *local_19e0;
  code *local_19d8;
  undefined8 uStack_19d0;
  code *local_19c8;
  code *pcStack_19c0;
  char *local_19b8;
  code *local_19b0;
  undefined8 uStack_19a8;
  code *local_19a0;
  code *pcStack_1998;
  char *local_1990;
  code *local_1988;
  undefined8 uStack_1980;
  code *local_1978;
  code *pcStack_1970;
  char *local_1968;
  code *local_1960;
  undefined8 uStack_1958;
  code *local_1950;
  code *pcStack_1948;
  char *local_1940;
  code *local_1938;
  undefined8 uStack_1930;
  code *local_1928;
  code *pcStack_1920;
  char *local_1918;
  code *local_1910;
  undefined8 uStack_1908;
  code *local_1900;
  code *pcStack_18f8;
  char *local_18f0;
  code *local_18e8;
  undefined8 uStack_18e0;
  code *local_18d8;
  code *pcStack_18d0;
  char *local_18c8;
  code *local_18c0;
  undefined8 uStack_18b8;
  code *local_18b0;
  code *pcStack_18a8;
  char *local_18a0;
  code *local_1898;
  undefined8 uStack_1890;
  code *local_1888;
  code *pcStack_1880;
  char *local_1878;
  code *local_1870;
  undefined8 uStack_1868;
  code *local_1860;
  code *pcStack_1858;
  char *local_1850;
  code *local_1848;
  undefined8 uStack_1840;
  code *local_1838;
  code *pcStack_1830;
  char *local_1828;
  code *local_1820;
  undefined8 uStack_1818;
  code *local_1810;
  code *pcStack_1808;
  char *local_1800;
  code *local_17f8;
  undefined8 uStack_17f0;
  code *local_17e8;
  code *pcStack_17e0;
  char *local_17d8;
  code *local_17d0;
  undefined8 uStack_17c8;
  code *local_17c0;
  code *pcStack_17b8;
  char *local_17b0;
  code *local_17a8;
  undefined8 uStack_17a0;
  code *local_1798;
  code *pcStack_1790;
  char *local_1788;
  code *local_1780;
  undefined8 uStack_1778;
  code *local_1770;
  code *pcStack_1768;
  char *local_1760;
  code *local_1758;
  undefined8 uStack_1750;
  code *local_1748;
  code *pcStack_1740;
  char *local_1738;
  code *local_1730;
  undefined8 uStack_1728;
  code *local_1720;
  code *pcStack_1718;
  char *local_1710;
  code *local_1708;
  undefined8 uStack_1700;
  code *local_16f8;
  code *pcStack_16f0;
  char *local_16e8;
  code *local_16e0;
  undefined8 uStack_16d8;
  code *local_16d0;
  code *pcStack_16c8;
  char *local_16c0;
  code *local_16b8;
  undefined8 uStack_16b0;
  code *local_16a8;
  code *pcStack_16a0;
  char *local_1698;
  code *local_1690;
  undefined8 uStack_1688;
  code *local_1680;
  code *pcStack_1678;
  char *local_1670;
  code *local_1668;
  undefined8 uStack_1660;
  code *local_1658;
  code *pcStack_1650;
  char *local_1648;
  code *local_1640;
  undefined8 uStack_1638;
  code *local_1630;
  code *pcStack_1628;
  char *local_1620;
  code *local_1618;
  undefined8 uStack_1610;
  code *local_1608;
  code *pcStack_1600;
  char *local_15f8;
  code *local_15f0;
  undefined8 uStack_15e8;
  code *local_15e0;
  code *pcStack_15d8;
  char *local_15d0;
  code *local_15c8;
  undefined8 uStack_15c0;
  code *local_15b8;
  code *pcStack_15b0;
  char *local_15a8;
  code *local_15a0;
  undefined8 uStack_1598;
  code *local_1590;
  code *pcStack_1588;
  char *local_1580;
  code *local_1578;
  undefined8 uStack_1570;
  code *local_1568;
  code *pcStack_1560;
  char *local_1558;
  code *local_1550;
  undefined8 uStack_1548;
  code *local_1540;
  code *pcStack_1538;
  char *local_1530;
  code *local_1528;
  undefined8 uStack_1520;
  code *local_1518;
  code *pcStack_1510;
  char *local_1508;
  code *local_1500;
  undefined8 uStack_14f8;
  code *local_14f0;
  code *pcStack_14e8;
  char *local_14e0;
  code *local_14d8;
  undefined8 uStack_14d0;
  code *local_14c8;
  code *pcStack_14c0;
  char *local_14b8;
  code *local_14b0;
  undefined8 uStack_14a8;
  code *local_14a0;
  code *pcStack_1498;
  char *local_1490;
  code *local_1488;
  undefined8 uStack_1480;
  code *local_1478;
  code *pcStack_1470;
  char *local_1468;
  code *local_1460;
  undefined8 uStack_1458;
  code *local_1450;
  code *pcStack_1448;
  char *local_1440;
  code *local_1438;
  undefined8 uStack_1430;
  code *local_1428;
  code *pcStack_1420;
  char *local_1418;
  code *local_1410;
  undefined8 uStack_1408;
  code *local_1400;
  code *pcStack_13f8;
  char *local_13f0;
  code *local_13e8;
  undefined8 uStack_13e0;
  code *local_13d8;
  code *pcStack_13d0;
  char *local_13c8;
  code *local_13c0;
  undefined8 uStack_13b8;
  code *local_13b0;
  code *pcStack_13a8;
  char *local_13a0;
  code *local_1398;
  undefined8 uStack_1390;
  code *local_1388;
  code *pcStack_1380;
  char *local_1378;
  code *local_1370;
  undefined8 uStack_1368;
  code *local_1360;
  code *pcStack_1358;
  char *local_1350;
  code *local_1348;
  undefined8 uStack_1340;
  code *local_1338;
  code *pcStack_1330;
  char *local_1328;
  code *local_1320;
  undefined8 uStack_1318;
  code *local_1310;
  code *pcStack_1308;
  char *local_1300;
  code *local_12f8;
  undefined8 uStack_12f0;
  code *local_12e8;
  code *pcStack_12e0;
  char *local_12d8;
  code *local_12d0;
  undefined8 uStack_12c8;
  code *local_12c0;
  code *pcStack_12b8;
  char *local_12b0;
  code *local_12a8;
  undefined8 uStack_12a0;
  code *local_1298;
  code *pcStack_1290;
  char *local_1288;
  code *local_1280;
  undefined8 uStack_1278;
  code *local_1270;
  code *pcStack_1268;
  char *local_1260;
  code *local_1258;
  undefined8 uStack_1250;
  code *local_1248;
  code *pcStack_1240;
  char *local_1238;
  code *local_1230;
  undefined8 uStack_1228;
  code *local_1220;
  code *pcStack_1218;
  char *local_1210;
  code *local_1208;
  undefined8 uStack_1200;
  code *local_11f8;
  code *pcStack_11f0;
  char *local_11e8;
  code *local_11e0;
  undefined8 uStack_11d8;
  code *local_11d0;
  code *pcStack_11c8;
  char *local_11c0;
  code *local_11b8;
  undefined8 uStack_11b0;
  code *local_11a8;
  code *pcStack_11a0;
  char *local_1198;
  code *local_1190;
  undefined8 uStack_1188;
  code *local_1180;
  code *pcStack_1178;
  char *local_1170;
  code *local_1168;
  undefined8 uStack_1160;
  code *local_1158;
  code *pcStack_1150;
  char *local_1148;
  code *local_1140;
  undefined8 uStack_1138;
  code *local_1130;
  code *pcStack_1128;
  char *local_1120;
  code *local_1118;
  undefined8 uStack_1110;
  code *local_1108;
  code *pcStack_1100;
  char *local_10f8;
  code *local_10f0;
  undefined8 uStack_10e8;
  code *local_10e0;
  code *pcStack_10d8;
  char *local_10d0;
  code *local_10c8;
  undefined8 uStack_10c0;
  code *local_10b8;
  code *pcStack_10b0;
  char *local_10a8;
  code *local_10a0;
  undefined8 uStack_1098;
  code *local_1090;
  code *pcStack_1088;
  char *local_1080;
  code *local_1078;
  undefined8 uStack_1070;
  code *local_1068;
  code *pcStack_1060;
  char *local_1058;
  code *local_1050;
  undefined8 uStack_1048;
  code *local_1040;
  code *pcStack_1038;
  char *local_1030;
  code *local_1028;
  undefined8 uStack_1020;
  code *local_1018;
  code *pcStack_1010;
  char *local_1008;
  code *local_1000;
  undefined8 uStack_ff8;
  code *local_ff0;
  code *pcStack_fe8;
  char *local_fe0;
  code *local_fd8;
  undefined8 uStack_fd0;
  code *local_fc8;
  code *pcStack_fc0;
  char *local_fb8;
  code *local_fb0;
  undefined8 uStack_fa8;
  code *local_fa0;
  code *pcStack_f98;
  char *local_f90;
  code *local_f88;
  undefined8 uStack_f80;
  code *local_f78;
  code *pcStack_f70;
  char *local_f68;
  code *local_f60;
  undefined8 uStack_f58;
  code *local_f50;
  code *pcStack_f48;
  char *local_f40;
  code *local_f38;
  undefined8 uStack_f30;
  code *local_f28;
  code *pcStack_f20;
  char *local_f18;
  code *local_f10;
  undefined8 uStack_f08;
  code *local_f00;
  code *pcStack_ef8;
  char *local_ef0;
  code *local_ee8;
  undefined8 uStack_ee0;
  code *local_ed8;
  code *pcStack_ed0;
  char *local_ec8;
  code *local_ec0;
  undefined8 uStack_eb8;
  code *local_eb0;
  code *pcStack_ea8;
  char *local_ea0;
  code *local_e98;
  undefined8 uStack_e90;
  code *local_e88;
  code *pcStack_e80;
  char *local_e78;
  code *local_e70;
  undefined8 uStack_e68;
  code *local_e60;
  code *pcStack_e58;
  char *local_e50;
  code *local_e48;
  undefined8 uStack_e40;
  code *local_e38;
  code *pcStack_e30;
  char *local_e28;
  code *local_e20;
  undefined8 uStack_e18;
  code *local_e10;
  code *pcStack_e08;
  char *local_e00;
  code *local_df8;
  undefined8 uStack_df0;
  code *local_de8;
  code *pcStack_de0;
  char *local_dd8;
  code *local_dd0;
  undefined8 uStack_dc8;
  code *local_dc0;
  code *pcStack_db8;
  char *local_db0;
  code *local_da8;
  undefined8 uStack_da0;
  code *local_d98;
  code *pcStack_d90;
  char *local_d88;
  code *local_d80;
  undefined8 uStack_d78;
  code *local_d70;
  code *pcStack_d68;
  char *local_d60;
  code *local_d58;
  undefined8 uStack_d50;
  code *local_d48;
  code *pcStack_d40;
  char *local_d38;
  code *local_d30;
  undefined8 uStack_d28;
  code *local_d20;
  code *pcStack_d18;
  char *local_d10;
  code *local_d08;
  undefined8 uStack_d00;
  code *local_cf8;
  code *pcStack_cf0;
  char *local_ce8;
  code *local_ce0;
  undefined8 uStack_cd8;
  code *local_cd0;
  code *pcStack_cc8;
  char *local_cc0;
  code *local_cb8;
  undefined8 uStack_cb0;
  code *local_ca8;
  code *pcStack_ca0;
  char *local_c98;
  code *local_c90;
  undefined8 uStack_c88;
  code *local_c80;
  code *pcStack_c78;
  char *local_c70;
  code *local_c68;
  undefined8 uStack_c60;
  code *local_c58;
  code *pcStack_c50;
  char *local_c48;
  code *local_c40;
  undefined8 uStack_c38;
  code *local_c30;
  code *pcStack_c28;
  char *local_c20;
  code *local_c18;
  undefined8 uStack_c10;
  code *local_c08;
  code *pcStack_c00;
  char *local_bf8;
  code *local_bf0;
  undefined8 uStack_be8;
  code *local_be0;
  code *pcStack_bd8;
  char *local_bd0;
  code *local_bc8;
  undefined8 uStack_bc0;
  code *local_bb8;
  code *pcStack_bb0;
  char *local_ba8;
  code *local_ba0;
  undefined8 uStack_b98;
  code *local_b90;
  code *pcStack_b88;
  char *local_b80;
  code *local_b78;
  undefined8 uStack_b70;
  code *local_b68;
  code *pcStack_b60;
  char *local_b58;
  code *local_b50;
  undefined8 uStack_b48;
  code *local_b40;
  code *pcStack_b38;
  char *local_b30;
  code *local_b28;
  undefined8 uStack_b20;
  code *local_b18;
  code *pcStack_b10;
  char *local_b08;
  code *local_b00;
  undefined8 uStack_af8;
  code *local_af0;
  code *pcStack_ae8;
  char *local_ae0;
  code *local_ad8;
  undefined8 uStack_ad0;
  code *local_ac8;
  code *pcStack_ac0;
  char *local_ab8;
  code *local_ab0;
  undefined8 uStack_aa8;
  code *local_aa0;
  code *pcStack_a98;
  char *local_a90;
  code *local_a88;
  undefined8 uStack_a80;
  code *local_a78;
  code *pcStack_a70;
  char *local_a68;
  code *local_a60;
  undefined8 uStack_a58;
  code *local_a50;
  code *pcStack_a48;
  char *local_a40;
  code *local_a38;
  undefined8 uStack_a30;
  code *local_a28;
  code *pcStack_a20;
  char *local_a18;
  code *local_a10;
  undefined8 uStack_a08;
  code *local_a00;
  code *pcStack_9f8;
  char *local_9f0;
  code *local_9e8;
  undefined8 uStack_9e0;
  code *local_9d8;
  code *pcStack_9d0;
  char *local_9c8;
  code *local_9c0;
  undefined8 uStack_9b8;
  code *local_9b0;
  code *pcStack_9a8;
  char *local_9a0;
  code *local_998;
  undefined8 uStack_990;
  code *local_988;
  code *pcStack_980;
  char *local_978;
  code *local_970;
  undefined8 uStack_968;
  code *local_960;
  code *pcStack_958;
  char *local_950;
  code *local_948;
  undefined8 uStack_940;
  code *local_938;
  code *pcStack_930;
  char *local_928;
  code *local_920;
  undefined8 uStack_918;
  code *local_910;
  code *pcStack_908;
  char *local_900;
  code *local_8f8;
  undefined8 uStack_8f0;
  code *local_8e8;
  code *pcStack_8e0;
  char *local_8d8;
  code *local_8d0;
  undefined8 uStack_8c8;
  code *local_8c0;
  code *pcStack_8b8;
  char *local_8b0;
  code *local_8a8;
  undefined8 uStack_8a0;
  code *local_898;
  code *pcStack_890;
  char *local_888;
  code *local_880;
  undefined8 uStack_878;
  code *local_870;
  code *pcStack_868;
  char *local_860;
  code *local_858;
  undefined8 uStack_850;
  code *local_848;
  code *pcStack_840;
  char *local_838;
  code *local_830;
  undefined8 uStack_828;
  code *local_820;
  code *pcStack_818;
  char *local_810;
  code *local_808;
  undefined8 uStack_800;
  code *local_7f8;
  code *pcStack_7f0;
  char *local_7e8;
  code *local_7e0;
  undefined8 uStack_7d8;
  code *local_7d0;
  code *pcStack_7c8;
  char *local_7c0;
  code *local_7b8;
  undefined8 uStack_7b0;
  code *local_7a8;
  code *pcStack_7a0;
  char *local_798;
  code *local_790;
  undefined8 uStack_788;
  code *local_780;
  code *pcStack_778;
  char *local_770;
  code *local_768;
  undefined8 uStack_760;
  code *local_758;
  code *pcStack_750;
  char *local_748;
  code *local_740;
  undefined8 uStack_738;
  code *local_730;
  code *pcStack_728;
  char *local_720;
  code *local_718;
  undefined8 uStack_710;
  code *local_708;
  code *pcStack_700;
  char *local_6f8;
  code *local_6f0;
  undefined8 uStack_6e8;
  code *local_6e0;
  code *pcStack_6d8;
  char *local_6d0;
  code *local_6c8;
  undefined8 uStack_6c0;
  code *local_6b8;
  code *pcStack_6b0;
  char *local_6a8;
  code *local_6a0;
  undefined8 uStack_698;
  code *local_690;
  code *pcStack_688;
  char *local_680;
  code *local_678;
  undefined8 uStack_670;
  code *local_668;
  code *pcStack_660;
  char *local_658;
  code *local_650;
  undefined8 uStack_648;
  code *local_640;
  code *pcStack_638;
  char *local_630;
  code *local_628;
  undefined8 uStack_620;
  code *local_618;
  code *pcStack_610;
  char *local_608;
  code *local_600;
  undefined8 uStack_5f8;
  code *local_5f0;
  code *pcStack_5e8;
  char *local_5e0;
  code *local_5d8;
  undefined8 uStack_5d0;
  code *local_5c8;
  code *pcStack_5c0;
  char *local_5b8;
  code *local_5b0;
  undefined8 uStack_5a8;
  code *local_5a0;
  code *pcStack_598;
  char *local_590;
  code *local_588;
  undefined8 uStack_580;
  code *local_578;
  code *pcStack_570;
  char *local_568;
  code *local_560;
  undefined8 uStack_558;
  code *local_550;
  code *pcStack_548;
  char *local_540;
  code *local_538;
  undefined8 uStack_530;
  code *local_528;
  code *pcStack_520;
  char *local_518;
  code *local_510;
  undefined8 uStack_508;
  code *local_500;
  code *pcStack_4f8;
  char *local_4f0;
  code *local_4e8;
  undefined8 uStack_4e0;
  code *local_4d8;
  code *pcStack_4d0;
  char *local_4c8;
  code *local_4c0;
  undefined8 uStack_4b8;
  code *local_4b0;
  code *pcStack_4a8;
  char *local_4a0;
  code *local_498;
  undefined8 uStack_490;
  code *local_488;
  code *pcStack_480;
  char *local_478;
  code *local_470;
  undefined8 uStack_468;
  code *local_460;
  code *pcStack_458;
  char *local_450;
  code *local_448;
  undefined8 uStack_440;
  code *local_438;
  code *pcStack_430;
  char *local_428;
  code *local_420;
  undefined8 uStack_418;
  code *local_410;
  code *pcStack_408;
  char *local_400;
  code *local_3f8;
  undefined8 uStack_3f0;
  code *local_3e8;
  code *pcStack_3e0;
  char *local_3d8;
  code *local_3d0;
  undefined8 uStack_3c8;
  code *local_3c0;
  code *pcStack_3b8;
  char *local_3b0;
  code *local_3a8;
  undefined8 uStack_3a0;
  code *local_398;
  code *pcStack_390;
  char *local_388;
  code *local_380;
  undefined8 uStack_378;
  code *local_370;
  code *pcStack_368;
  char *local_360;
  code *local_358;
  undefined8 uStack_350;
  code *local_348;
  code *pcStack_340;
  char *local_338;
  code *local_330;
  undefined8 uStack_328;
  code *local_320;
  code *pcStack_318;
  char *local_310;
  code *local_308;
  undefined8 uStack_300;
  code *local_2f8;
  code *pcStack_2f0;
  char *local_2e8;
  code *local_2e0;
  undefined8 uStack_2d8;
  code *local_2d0;
  code *pcStack_2c8;
  char *local_2c0;
  code *local_2b8;
  undefined8 uStack_2b0;
  code *local_2a8;
  code *pcStack_2a0;
  char *local_298;
  code *local_290;
  undefined8 uStack_288;
  code *local_280;
  code *pcStack_278;
  char *local_270;
  code *local_268;
  undefined8 uStack_260;
  code *local_258;
  code *pcStack_250;
  char *local_248;
  code *local_240;
  undefined8 uStack_238;
  code *local_230;
  code *pcStack_228;
  char *local_220;
  code *local_218;
  undefined8 uStack_210;
  code *local_208;
  code *pcStack_200;
  char *local_1f8;
  code *local_1f0;
  undefined8 uStack_1e8;
  code *local_1e0;
  code *pcStack_1d8;
  char *local_1d0;
  code *local_1c8;
  undefined8 uStack_1c0;
  code *local_1b8;
  code *pcStack_1b0;
  char *local_1a8;
  code *local_1a0;
  undefined8 uStack_198;
  code *local_190;
  code *pcStack_188;
  char *local_180;
  code *local_178;
  undefined8 uStack_170;
  code *local_168;
  code *pcStack_160;
  char *local_158;
  code *local_150;
  undefined8 uStack_148;
  code *local_140;
  code *pcStack_138;
  char *local_130;
  code *local_128;
  undefined8 uStack_120;
  code *local_118;
  code *pcStack_110;
  char *local_108;
  code *local_100;
  undefined8 uStack_f8;
  code *local_f0;
  code *pcStack_e8;
  char *local_e0;
  code *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *pcStack_c0;
  char *local_b8;
  code *local_b0;
  undefined8 uStack_a8;
  code *local_a0;
  code *pcStack_98;
  char *local_90;
  code *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  char *local_68;
  code *local_60;
  undefined8 uStack_58;
  code *local_50;
  code *pcStack_48;
  char *local_40;
  
  (this->super_Tester).suite_ = suite;
  (this->super_Tester).cntPassed_ = 0;
  (this->super_Tester).cntFailed_ = 0;
  (this->super_Tester).curTestFunc_._M_dataplus._M_p =
       (pointer)&(this->super_Tester).curTestFunc_.field_2;
  (this->super_Tester).curTestFunc_._M_string_length = 0;
  (this->super_Tester).curTestFunc_.field_2._M_local_buf[0] = '\0';
  (this->super_Tester)._vptr_Tester = (_func_int **)&PTR__SemanticModelTester_0053b358;
  (this->tree_)._M_t.
  super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>.
  super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl = (SyntaxTree *)0x0;
  (this->compilation_)._M_t.
  super___uniq_ptr_impl<psy::C::Compilation,_std::default_delete<psy::C::Compilation>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::Compilation_*,_std::default_delete<psy::C::Compilation>_>.
  super__Head_base<0UL,_psy::C::Compilation_*,_false>._M_head_impl = (Compilation *)0x0;
  local_2a68[0] = case0001;
  local_2a68[1] = (code *)0x0;
  pcStack_2a50 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2a58 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2a48 = "case0001";
  local_2a40 = case0002;
  uStack_2a38 = 0;
  pcStack_2a28 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2a30 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2a20 = "case0002";
  local_2a18 = case0003;
  uStack_2a10 = 0;
  pcStack_2a00 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2a08 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_29f8 = "case0003";
  local_29f0 = case0004;
  uStack_29e8 = 0;
  pcStack_29d8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_29e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_29d0 = "case0004";
  local_29c8 = case0005;
  uStack_29c0 = 0;
  pcStack_29b0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_29b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_29a8 = "case0005";
  local_29a0 = case0006;
  uStack_2998 = 0;
  pcStack_2988 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2990 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2980 = "case0006";
  local_2978 = case0007;
  uStack_2970 = 0;
  pcStack_2960 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2968 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2958 = "case0007";
  local_2950 = case0008;
  uStack_2948 = 0;
  pcStack_2938 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2940 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2930 = "case0008";
  local_2928 = case0009;
  uStack_2920 = 0;
  pcStack_2910 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2918 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2908 = "case0009";
  local_2900 = case0010;
  uStack_28f8 = 0;
  pcStack_28e8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_28f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_28e0 = "case0010";
  local_28d8 = case0090;
  uStack_28d0 = 0;
  pcStack_28c0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_28c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_28b8 = "case0090";
  local_28b0 = case0091;
  uStack_28a8 = 0;
  pcStack_2898 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_28a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2890 = "case0091";
  local_2888 = case0092;
  uStack_2880 = 0;
  pcStack_2870 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2878 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2868 = "case0092";
  local_2860 = case0093;
  uStack_2858 = 0;
  pcStack_2848 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2850 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2840 = "case0093";
  local_2838 = case0094;
  uStack_2830 = 0;
  pcStack_2820 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2828 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2818 = "case0094";
  local_2810 = case0095;
  uStack_2808 = 0;
  pcStack_27f8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2800 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_27f0 = "case0095";
  local_27e8 = case0096;
  uStack_27e0 = 0;
  pcStack_27d0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_27d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_27c8 = "case0096";
  local_27c0 = case0097;
  uStack_27b8 = 0;
  pcStack_27a8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_27b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_27a0 = "case0097";
  local_2798 = case0098;
  uStack_2790 = 0;
  pcStack_2780 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2788 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2778 = "case0098";
  local_2770 = case0099;
  uStack_2768 = 0;
  pcStack_2758 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2760 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2750 = "case0099";
  local_2748 = case0101;
  uStack_2740 = 0;
  pcStack_2730 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2738 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2728 = "case0101";
  local_2720 = case0102;
  uStack_2718 = 0;
  pcStack_2708 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2710 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2700 = "case0102";
  local_26f8 = case0103;
  uStack_26f0 = 0;
  pcStack_26e0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_26e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_26d8 = "case0103";
  local_26d0 = case0104;
  uStack_26c8 = 0;
  pcStack_26b8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_26c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_26b0 = "case0104";
  local_26a8 = case0105;
  uStack_26a0 = 0;
  pcStack_2690 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2698 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2688 = "case0105";
  local_2680 = case0106;
  uStack_2678 = 0;
  pcStack_2668 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2670 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2660 = "case0106";
  local_2658 = case0107;
  uStack_2650 = 0;
  pcStack_2640 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2648 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2638 = "case0107";
  local_2630 = case0108;
  uStack_2628 = 0;
  pcStack_2618 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2620 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2610 = "case0108";
  local_2608 = case0109;
  uStack_2600 = 0;
  pcStack_25f0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_25f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_25e8 = "case0109";
  local_25e0 = case0110;
  uStack_25d8 = 0;
  pcStack_25c8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_25d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_25c0 = "case0110";
  local_25b8 = case0150;
  uStack_25b0 = 0;
  pcStack_25a0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_25a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2598 = "case0150";
  local_2590 = case0151;
  uStack_2588 = 0;
  pcStack_2578 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2580 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2570 = "case0151";
  local_2568 = case0152;
  uStack_2560 = 0;
  pcStack_2550 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2558 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2548 = "case0152";
  local_2540 = case0153;
  uStack_2538 = 0;
  pcStack_2528 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2530 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2520 = "case0153";
  local_2518 = case0154;
  uStack_2510 = 0;
  pcStack_2500 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2508 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_24f8 = "case0154";
  local_24f0 = case0155;
  uStack_24e8 = 0;
  pcStack_24d8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_24e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_24d0 = "case0155";
  local_24c8 = case0156;
  uStack_24c0 = 0;
  pcStack_24b0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_24b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_24a8 = "case0156";
  local_24a0 = case0157;
  uStack_2498 = 0;
  pcStack_2488 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2490 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2480 = "case0157";
  local_2478 = case0158;
  uStack_2470 = 0;
  pcStack_2460 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2468 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2458 = "case0158";
  local_2450 = case0159;
  uStack_2448 = 0;
  pcStack_2438 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2440 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2430 = "case0159";
  local_2428 = case0201;
  uStack_2420 = 0;
  pcStack_2410 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2418 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2408 = "case0201";
  local_2400 = case0202;
  uStack_23f8 = 0;
  pcStack_23e8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_23f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_23e0 = "case0202";
  local_23d8 = case0203;
  uStack_23d0 = 0;
  pcStack_23c0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_23c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_23b8 = "case0203";
  local_23b0 = case0204;
  uStack_23a8 = 0;
  pcStack_2398 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_23a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2390 = "case0204";
  local_2388 = case0205;
  uStack_2380 = 0;
  pcStack_2370 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2378 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2368 = "case0205";
  local_2360 = case0206;
  uStack_2358 = 0;
  pcStack_2348 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2350 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2340 = "case0206";
  local_2338 = case0207;
  uStack_2330 = 0;
  pcStack_2320 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2328 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2318 = "case0207";
  local_2310 = case0208;
  uStack_2308 = 0;
  pcStack_22f8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2300 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_22f0 = "case0208";
  local_22e8 = case0209;
  uStack_22e0 = 0;
  pcStack_22d0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_22d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_22c8 = "case0209";
  local_22c0 = case0210;
  uStack_22b8 = 0;
  pcStack_22a8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_22b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_22a0 = "case0210";
  local_2298 = case0211;
  uStack_2290 = 0;
  pcStack_2280 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2288 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2278 = "case0211";
  local_2270 = case0212;
  uStack_2268 = 0;
  pcStack_2258 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2260 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2250 = "case0212";
  local_2248 = case0213;
  uStack_2240 = 0;
  pcStack_2230 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2238 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2228 = "case0213";
  local_2220 = case0214;
  uStack_2218 = 0;
  pcStack_2208 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2210 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2200 = "case0214";
  local_21f8 = case0215;
  uStack_21f0 = 0;
  pcStack_21e0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_21e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_21d8 = "case0215";
  local_21d0 = case0216;
  uStack_21c8 = 0;
  pcStack_21b8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_21c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_21b0 = "case0216";
  local_21a8 = case0217;
  uStack_21a0 = 0;
  pcStack_2190 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2198 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2188 = "case0217";
  local_2180 = case0218;
  uStack_2178 = 0;
  pcStack_2168 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2170 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2160 = "case0218";
  local_2158 = case0219;
  uStack_2150 = 0;
  pcStack_2140 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2148 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2138 = "case0219";
  local_2130 = case0220;
  uStack_2128 = 0;
  pcStack_2118 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2120 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2110 = "case0220";
  local_2108 = case0300;
  uStack_2100 = 0;
  pcStack_20f0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_20f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_20e8 = "case0300";
  local_20e0 = case0301;
  uStack_20d8 = 0;
  pcStack_20c8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_20d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_20c0 = "case0301";
  local_20b8 = case0302;
  uStack_20b0 = 0;
  pcStack_20a0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_20a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2098 = "case0302";
  local_2090 = case0303;
  uStack_2088 = 0;
  pcStack_2078 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2080 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2070 = "case0303";
  local_2068 = case0304;
  uStack_2060 = 0;
  pcStack_2050 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2058 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2048 = "case0304";
  local_2040 = case0305;
  uStack_2038 = 0;
  pcStack_2028 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2030 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2020 = "case0305";
  local_2018 = case0306;
  uStack_2010 = 0;
  pcStack_2000 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_2008 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1ff8 = "case0306";
  local_1ff0 = case0307;
  uStack_1fe8 = 0;
  pcStack_1fd8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1fe0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1fd0 = "case0307";
  local_1fc8 = case0308;
  uStack_1fc0 = 0;
  pcStack_1fb0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1fb8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1fa8 = "case0308";
  local_1fa0 = case0309;
  uStack_1f98 = 0;
  pcStack_1f88 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1f90 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1f80 = "case0309";
  local_1f78 = case0310;
  uStack_1f70 = 0;
  pcStack_1f60 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1f68 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1f58 = "case0310";
  local_1f50 = case0311;
  uStack_1f48 = 0;
  pcStack_1f38 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1f40 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1f30 = "case0311";
  local_1f28 = case0312;
  uStack_1f20 = 0;
  pcStack_1f10 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1f18 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1f08 = "case0312";
  local_1f00 = case0313;
  uStack_1ef8 = 0;
  pcStack_1ee8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1ef0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1ee0 = "case0313";
  local_1ed8 = case0314;
  uStack_1ed0 = 0;
  pcStack_1ec0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1ec8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1eb8 = "case0314";
  local_1eb0 = case0315;
  uStack_1ea8 = 0;
  pcStack_1e98 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1ea0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1e90 = "case0315";
  local_1e88 = case0316;
  uStack_1e80 = 0;
  pcStack_1e70 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1e78 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1e68 = "case0316";
  local_1e60 = case0317;
  uStack_1e58 = 0;
  pcStack_1e48 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1e50 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1e40 = "case0317";
  local_1e38 = case0318;
  uStack_1e30 = 0;
  pcStack_1e20 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1e28 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1e18 = "case0318";
  local_1e10 = case0319;
  uStack_1e08 = 0;
  pcStack_1df8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1e00 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1df0 = "case0319";
  local_1de8 = case0320;
  uStack_1de0 = 0;
  pcStack_1dd0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1dd8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1dc8 = "case0320";
  local_1dc0 = case0321;
  uStack_1db8 = 0;
  pcStack_1da8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1db0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1da0 = "case0321";
  local_1d98 = case0322;
  uStack_1d90 = 0;
  pcStack_1d80 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1d88 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1d78 = "case0322";
  local_1d70 = case0323;
  uStack_1d68 = 0;
  pcStack_1d58 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1d60 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1d50 = "case0323";
  local_1d48 = case0324;
  uStack_1d40 = 0;
  pcStack_1d30 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1d38 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1d28 = "case0324";
  local_1d20 = case0325;
  uStack_1d18 = 0;
  pcStack_1d08 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1d10 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1d00 = "case0325";
  local_1cf8 = case0326;
  uStack_1cf0 = 0;
  pcStack_1ce0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1ce8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1cd8 = "case0326";
  local_1cd0 = case0327;
  uStack_1cc8 = 0;
  pcStack_1cb8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1cc0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1cb0 = "case0327";
  local_1ca8 = case0328;
  uStack_1ca0 = 0;
  pcStack_1c90 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1c98 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1c88 = "case0328";
  local_1c80 = case0329;
  uStack_1c78 = 0;
  pcStack_1c68 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1c70 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1c60 = "case0329";
  local_1c58 = case0330;
  uStack_1c50 = 0;
  pcStack_1c40 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1c48 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1c38 = "case0330";
  local_1c30 = case0331;
  uStack_1c28 = 0;
  pcStack_1c18 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1c20 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1c10 = "case0331";
  local_1c08 = case0332;
  uStack_1c00 = 0;
  pcStack_1bf0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1bf8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1be8 = "case0332";
  local_1be0 = case0333;
  uStack_1bd8 = 0;
  pcStack_1bc8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1bd0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1bc0 = "case0333";
  local_1bb8 = case0334;
  uStack_1bb0 = 0;
  pcStack_1ba0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1ba8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1b98 = "case0334";
  local_1b90 = case0335;
  uStack_1b88 = 0;
  pcStack_1b78 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1b80 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1b70 = "case0335";
  local_1b68 = case0336;
  uStack_1b60 = 0;
  pcStack_1b50 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1b58 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1b48 = "case0336";
  local_1b40 = case0337;
  uStack_1b38 = 0;
  pcStack_1b28 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1b30 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1b20 = "case0337";
  local_1b18 = case0338;
  uStack_1b10 = 0;
  pcStack_1b00 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1b08 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1af8 = "case0338";
  local_1af0 = case0339;
  uStack_1ae8 = 0;
  pcStack_1ad8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1ae0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1ad0 = "case0339";
  local_1ac8 = case0340;
  uStack_1ac0 = 0;
  pcStack_1ab0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1ab8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1aa8 = "case0340";
  local_1aa0 = case0341;
  uStack_1a98 = 0;
  pcStack_1a88 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1a90 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1a80 = "case0341";
  local_1a78 = case0342;
  uStack_1a70 = 0;
  pcStack_1a60 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1a68 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1a58 = "case0342";
  local_1a50 = case0343;
  uStack_1a48 = 0;
  pcStack_1a38 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1a40 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1a30 = "case0343";
  local_1a28 = case0344;
  uStack_1a20 = 0;
  pcStack_1a10 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1a18 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1a08 = "case0344";
  local_1a00 = case0345;
  uStack_19f8 = 0;
  pcStack_19e8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_19f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_19e0 = "case0345";
  local_19d8 = case0346;
  uStack_19d0 = 0;
  pcStack_19c0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_19c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_19b8 = "case0346";
  local_19b0 = case0347;
  uStack_19a8 = 0;
  pcStack_1998 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_19a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1990 = "case0347";
  local_1988 = case0348;
  uStack_1980 = 0;
  pcStack_1970 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1978 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1968 = "case0348";
  local_1960 = case0349;
  uStack_1958 = 0;
  pcStack_1948 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1950 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1940 = "case0349";
  local_1938 = case0350;
  uStack_1930 = 0;
  pcStack_1920 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1928 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1918 = "case0350";
  local_1910 = case0351;
  uStack_1908 = 0;
  pcStack_18f8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1900 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_18f0 = "case0351";
  local_18e8 = case0352;
  uStack_18e0 = 0;
  pcStack_18d0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_18d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_18c8 = "case0352";
  local_18c0 = case0353;
  uStack_18b8 = 0;
  pcStack_18a8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_18b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_18a0 = "case0353";
  local_1898 = case0354;
  uStack_1890 = 0;
  pcStack_1880 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1888 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1878 = "case0354";
  local_1870 = case0355;
  uStack_1868 = 0;
  pcStack_1858 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1860 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1850 = "case0355";
  local_1848 = case0356;
  uStack_1840 = 0;
  pcStack_1830 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1838 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1828 = "case0356";
  local_1820 = case0357;
  uStack_1818 = 0;
  pcStack_1808 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1810 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1800 = "case0357";
  local_17f8 = case0358;
  uStack_17f0 = 0;
  pcStack_17e0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_17e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_17d8 = "case0358";
  local_17d0 = case0359;
  uStack_17c8 = 0;
  pcStack_17b8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_17c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_17b0 = "case0359";
  local_17a8 = case0360;
  uStack_17a0 = 0;
  pcStack_1790 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1798 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1788 = "case0360";
  local_1780 = case0361;
  uStack_1778 = 0;
  pcStack_1768 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1770 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1760 = "case0361";
  local_1758 = case0362;
  uStack_1750 = 0;
  pcStack_1740 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1748 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1738 = "case0362";
  local_1730 = case0363;
  uStack_1728 = 0;
  pcStack_1718 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1720 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1710 = "case0363";
  local_1708 = case0364;
  uStack_1700 = 0;
  pcStack_16f0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_16f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_16e8 = "case0364";
  local_16e0 = case0365;
  uStack_16d8 = 0;
  pcStack_16c8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_16d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_16c0 = "case0365";
  local_16b8 = case0366;
  uStack_16b0 = 0;
  pcStack_16a0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_16a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1698 = "case0366";
  local_1690 = case0367;
  uStack_1688 = 0;
  pcStack_1678 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1680 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1670 = "case0367";
  local_1668 = case0368;
  uStack_1660 = 0;
  pcStack_1650 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1658 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1648 = "case0368";
  local_1640 = case0369;
  uStack_1638 = 0;
  pcStack_1628 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1630 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1620 = "case0369";
  local_1618 = case0370;
  uStack_1610 = 0;
  pcStack_1600 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1608 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_15f8 = "case0370";
  local_15f0 = case0371;
  uStack_15e8 = 0;
  pcStack_15d8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_15e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_15d0 = "case0371";
  local_15c8 = case0372;
  uStack_15c0 = 0;
  pcStack_15b0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_15b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_15a8 = "case0372";
  local_15a0 = case0373;
  uStack_1598 = 0;
  pcStack_1588 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1590 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1580 = "case0373";
  local_1578 = case0374;
  uStack_1570 = 0;
  pcStack_1560 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1568 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1558 = "case0374";
  local_1550 = case0375;
  uStack_1548 = 0;
  pcStack_1538 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1540 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1530 = "case0375";
  local_1528 = case0376;
  uStack_1520 = 0;
  pcStack_1510 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1518 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1508 = "case0376";
  local_1500 = case0377;
  uStack_14f8 = 0;
  pcStack_14e8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_14f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_14e0 = "case0377";
  local_14d8 = case0378;
  uStack_14d0 = 0;
  pcStack_14c0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_14b8 = "case0378";
  local_14b0 = case0379;
  uStack_14a8 = 0;
  pcStack_1498 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_14a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1490 = "case0379";
  local_1488 = case0380;
  uStack_1480 = 0;
  pcStack_1470 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1478 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1468 = "case0380";
  local_1460 = case0381;
  uStack_1458 = 0;
  pcStack_1448 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1450 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1440 = "case0381";
  local_1438 = case0382;
  uStack_1430 = 0;
  pcStack_1420 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1428 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1418 = "case0382";
  local_1410 = case0383;
  uStack_1408 = 0;
  pcStack_13f8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1400 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_13f0 = "case0383";
  local_13e8 = case0384;
  uStack_13e0 = 0;
  pcStack_13d0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_13d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_13c8 = "case0384";
  local_13c0 = case0385;
  uStack_13b8 = 0;
  pcStack_13a8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_13b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_13a0 = "case0385";
  local_1398 = case0386;
  uStack_1390 = 0;
  pcStack_1380 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1388 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1378 = "case0386";
  local_1370 = case0387;
  uStack_1368 = 0;
  pcStack_1358 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1360 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1350 = "case0387";
  local_1348 = case0388;
  uStack_1340 = 0;
  pcStack_1330 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1338 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1328 = "case0388";
  local_1320 = case0389;
  uStack_1318 = 0;
  pcStack_1308 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1310 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1300 = "case0389";
  local_12f8 = case0390;
  uStack_12f0 = 0;
  pcStack_12e0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_12e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_12d8 = "case0390";
  local_12d0 = case0391;
  uStack_12c8 = 0;
  pcStack_12b8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_12c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_12b0 = "case0391";
  local_12a8 = case0392;
  uStack_12a0 = 0;
  pcStack_1290 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1298 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1288 = "case0392";
  local_1280 = case0393;
  uStack_1278 = 0;
  pcStack_1268 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1270 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1260 = "case0393";
  local_1258 = case0394;
  uStack_1250 = 0;
  pcStack_1240 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1248 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1238 = "case0394";
  local_1230 = case0395;
  uStack_1228 = 0;
  pcStack_1218 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1220 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1210 = "case0395";
  local_1208 = case0396;
  uStack_1200 = 0;
  pcStack_11f0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_11f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_11e8 = "case0396";
  local_11e0 = case0397;
  uStack_11d8 = 0;
  pcStack_11c8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_11d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_11c0 = "case0397";
  local_11b8 = case0398;
  uStack_11b0 = 0;
  pcStack_11a0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_11a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1198 = "case0398";
  local_1190 = case0399;
  uStack_1188 = 0;
  pcStack_1178 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1180 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1170 = "case0399";
  local_1168 = case0400;
  uStack_1160 = 0;
  pcStack_1150 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1158 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1148 = "case0400";
  local_1140 = case0401;
  uStack_1138 = 0;
  pcStack_1128 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1130 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1120 = "case0401";
  local_1118 = case0402;
  uStack_1110 = 0;
  pcStack_1100 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1108 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_10f8 = "case0402";
  local_10f0 = case0403;
  uStack_10e8 = 0;
  pcStack_10d8 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_10e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_10d0 = "case0403";
  local_10c8 = case0404;
  uStack_10c0 = 0;
  pcStack_10b0 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_10b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_10a8 = "case0404";
  local_10a0 = case0405;
  uStack_1098 = 0;
  pcStack_1088 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1090 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1080 = "case0405";
  local_1078 = case0406;
  uStack_1070 = 0;
  pcStack_1060 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1068 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1058 = "case0406";
  local_1050 = case0407;
  uStack_1048 = 0;
  pcStack_1038 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1040 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1030 = "case0407";
  local_1028 = case0408;
  uStack_1020 = 0;
  pcStack_1010 = std::
                 _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                 ::_M_invoke;
  local_1018 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1008 = "case0408";
  local_1000 = case0409;
  uStack_ff8 = 0;
  pcStack_fe8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_ff0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_fe0 = "case0409";
  local_fd8 = case0410;
  uStack_fd0 = 0;
  pcStack_fc0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_fc8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_fb8 = "case0410";
  local_fb0 = case0411;
  uStack_fa8 = 0;
  pcStack_f98 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_fa0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_f90 = "case0411";
  local_f88 = case0412;
  uStack_f80 = 0;
  pcStack_f70 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_f78 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_f68 = "case0412";
  local_f60 = case0413;
  uStack_f58 = 0;
  pcStack_f48 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_f50 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_f40 = "case0413";
  local_f38 = case0414;
  uStack_f30 = 0;
  pcStack_f20 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_f28 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_f18 = "case0414";
  local_f10 = case0415;
  uStack_f08 = 0;
  pcStack_ef8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_f00 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ef0 = "case0415";
  local_ee8 = case0416;
  uStack_ee0 = 0;
  pcStack_ed0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_ed8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ec8 = "case0416";
  local_ec0 = case0417;
  uStack_eb8 = 0;
  pcStack_ea8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_eb0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ea0 = "case0417";
  local_e98 = case0418;
  uStack_e90 = 0;
  pcStack_e80 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_e88 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_e78 = "case0418";
  local_e70 = case0419;
  uStack_e68 = 0;
  pcStack_e58 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_e60 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_e50 = "case0419";
  local_e48 = case0420;
  uStack_e40 = 0;
  pcStack_e30 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_e38 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_e28 = "case0420";
  local_e20 = case0421;
  uStack_e18 = 0;
  pcStack_e08 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_e10 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_e00 = "case0421";
  local_df8 = case0422;
  uStack_df0 = 0;
  pcStack_de0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_de8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_dd8 = "case0422";
  local_dd0 = case0423;
  uStack_dc8 = 0;
  pcStack_db8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_dc0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_db0 = "case0423";
  local_da8 = case0424;
  uStack_da0 = 0;
  pcStack_d90 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_d98 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_d88 = "case0424";
  local_d80 = case0425;
  uStack_d78 = 0;
  pcStack_d68 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_d70 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_d60 = "case0425";
  local_d58 = case0426;
  uStack_d50 = 0;
  pcStack_d40 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_d48 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_d38 = "case0426";
  local_d30 = case0427;
  uStack_d28 = 0;
  pcStack_d18 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_d20 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_d10 = "case0427";
  local_d08 = case0428;
  uStack_d00 = 0;
  pcStack_cf0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_cf8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ce8 = "case0428";
  local_ce0 = case0429;
  uStack_cd8 = 0;
  pcStack_cc8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_cd0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_cc0 = "case0429";
  local_cb8 = case0430;
  uStack_cb0 = 0;
  pcStack_ca0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_ca8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_c98 = "case0430";
  local_c90 = case0431;
  uStack_c88 = 0;
  pcStack_c78 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_c80 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_c70 = "case0431";
  local_c68 = case0432;
  uStack_c60 = 0;
  pcStack_c50 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_c58 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_c48 = "case0432";
  local_c40 = case0433;
  uStack_c38 = 0;
  pcStack_c28 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_c30 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_c20 = "case0433";
  local_c18 = case0434;
  uStack_c10 = 0;
  pcStack_c00 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_c08 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_bf8 = "case0434";
  local_bf0 = case0435;
  uStack_be8 = 0;
  pcStack_bd8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_be0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_bd0 = "case0435";
  local_bc8 = case0436;
  uStack_bc0 = 0;
  pcStack_bb0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_bb8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ba8 = "case0436";
  local_ba0 = case0437;
  uStack_b98 = 0;
  pcStack_b88 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_b90 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_b80 = "case0437";
  local_b78 = case0438;
  uStack_b70 = 0;
  pcStack_b60 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_b68 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_b58 = "case0438";
  local_b50 = case0439;
  uStack_b48 = 0;
  pcStack_b38 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_b40 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_b30 = "case0439";
  local_b28 = case0440;
  uStack_b20 = 0;
  pcStack_b10 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_b18 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_b08 = "case0440";
  local_b00 = case0441;
  uStack_af8 = 0;
  pcStack_ae8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_af0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ae0 = "case0441";
  local_ad8 = case0442;
  uStack_ad0 = 0;
  pcStack_ac0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_ac8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ab8 = "case0442";
  local_ab0 = case0443;
  uStack_aa8 = 0;
  pcStack_a98 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_aa0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_a90 = "case0443";
  local_a88 = case0444;
  uStack_a80 = 0;
  pcStack_a70 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_a78 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_a68 = "case0444";
  local_a60 = case0445;
  uStack_a58 = 0;
  pcStack_a48 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_a50 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_a40 = "case0445";
  local_a38 = case0446;
  uStack_a30 = 0;
  pcStack_a20 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_a28 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_a18 = "case0446";
  local_a10 = case0447;
  uStack_a08 = 0;
  pcStack_9f8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_a00 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_9f0 = "case0447";
  local_9e8 = case0448;
  uStack_9e0 = 0;
  pcStack_9d0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_9d8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_9c8 = "case0448";
  local_9c0 = case0449;
  uStack_9b8 = 0;
  pcStack_9a8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_9b0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_9a0 = "case0449";
  local_998 = case0450;
  uStack_990 = 0;
  pcStack_980 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_988 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_978 = "case0450";
  local_970 = case0451;
  uStack_968 = 0;
  pcStack_958 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_960 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_950 = "case0451";
  local_948 = case0452;
  uStack_940 = 0;
  pcStack_930 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_938 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_928 = "case0452";
  local_920 = case0453;
  uStack_918 = 0;
  pcStack_908 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_910 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_900 = "case0453";
  local_8f8 = case0454;
  uStack_8f0 = 0;
  pcStack_8e0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_8e8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_8d8 = "case0454";
  local_8d0 = case0455;
  uStack_8c8 = 0;
  pcStack_8b8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_8c0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_8b0 = "case0455";
  local_8a8 = case0456;
  uStack_8a0 = 0;
  pcStack_890 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_898 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_888 = "case0456";
  local_880 = case0457;
  uStack_878 = 0;
  pcStack_868 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_870 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_860 = "case0457";
  local_858 = case0458;
  uStack_850 = 0;
  pcStack_840 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_848 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_838 = "case0458";
  local_830 = case0459;
  uStack_828 = 0;
  pcStack_818 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_820 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_810 = "case0459";
  local_808 = case0460;
  uStack_800 = 0;
  pcStack_7f0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_7f8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_7e8 = "case0460";
  local_7e0 = case0461;
  uStack_7d8 = 0;
  pcStack_7c8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_7d0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_7c0 = "case0461";
  local_7b8 = case0462;
  uStack_7b0 = 0;
  pcStack_7a0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_7a8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_798 = "case0462";
  local_790 = case0463;
  uStack_788 = 0;
  pcStack_778 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_780 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_770 = "case0463";
  local_768 = case0464;
  uStack_760 = 0;
  pcStack_750 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_748 = "case0464";
  local_740 = case0465;
  uStack_738 = 0;
  pcStack_728 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_730 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_720 = "case0465";
  local_718 = case0466;
  uStack_710 = 0;
  pcStack_700 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_708 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_6f8 = "case0466";
  local_6f0 = case0467;
  uStack_6e8 = 0;
  pcStack_6d8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_6e0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_6d0 = "case0467";
  local_6c8 = case0468;
  uStack_6c0 = 0;
  pcStack_6b0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_6b8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_6a8 = "case0468";
  local_6a0 = case0469;
  uStack_698 = 0;
  pcStack_688 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_690 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_680 = "case0469";
  local_678 = case0470;
  uStack_670 = 0;
  pcStack_660 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_668 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_658 = "case0470";
  local_650 = case0471;
  uStack_648 = 0;
  pcStack_638 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_640 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_630 = "case0471";
  local_628 = case0472;
  uStack_620 = 0;
  pcStack_610 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_618 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_608 = "case0472";
  local_600 = case0473;
  uStack_5f8 = 0;
  pcStack_5e8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_5f0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_5e0 = "case0473";
  local_5d8 = case0474;
  uStack_5d0 = 0;
  pcStack_5c0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_5c8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_5b8 = "case0474";
  local_5b0 = case0475;
  uStack_5a8 = 0;
  pcStack_598 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_5a0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_590 = "case0475";
  local_588 = case0476;
  uStack_580 = 0;
  pcStack_570 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_578 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_568 = "case0476";
  local_560 = case0477;
  uStack_558 = 0;
  pcStack_548 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_550 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_540 = "case0477";
  local_538 = case0478;
  uStack_530 = 0;
  pcStack_520 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_528 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_518 = "case0478";
  local_510 = case0479;
  uStack_508 = 0;
  pcStack_4f8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_500 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_4f0 = "case0479";
  local_4e8 = case0480;
  uStack_4e0 = 0;
  pcStack_4d0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_4d8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_4c8 = "case0480";
  local_4c0 = case0481;
  uStack_4b8 = 0;
  pcStack_4a8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_4b0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_4a0 = "case0481";
  local_498 = case0482;
  uStack_490 = 0;
  pcStack_480 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_488 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_478 = "case0482";
  local_470 = case0483;
  uStack_468 = 0;
  pcStack_458 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_460 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_450 = "case0483";
  local_448 = case0484;
  uStack_440 = 0;
  pcStack_430 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_438 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_428 = "case0484";
  local_420 = case0485;
  uStack_418 = 0;
  pcStack_408 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_410 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_400 = "case0485";
  local_3f8 = case0486;
  uStack_3f0 = 0;
  pcStack_3e0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_3e8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_3d8 = "case0486";
  local_3d0 = case0487;
  uStack_3c8 = 0;
  pcStack_3b8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_3c0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_3b0 = "case0487";
  local_3a8 = case0488;
  uStack_3a0 = 0;
  pcStack_390 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_398 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_388 = "case0488";
  local_380 = case0489;
  uStack_378 = 0;
  pcStack_368 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_370 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_360 = "case0489";
  local_358 = case0490;
  uStack_350 = 0;
  pcStack_340 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_348 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_338 = "case0490";
  local_330 = case0491;
  uStack_328 = 0;
  pcStack_318 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_320 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_310 = "case0491";
  local_308 = case0492;
  uStack_300 = 0;
  pcStack_2f0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_2f8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_2e8 = "case0492";
  local_2e0 = case0493;
  uStack_2d8 = 0;
  pcStack_2c8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_2d0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_2c0 = "case0493";
  local_2b8 = case0494;
  uStack_2b0 = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_298 = "case0494";
  local_290 = case0495;
  uStack_288 = 0;
  pcStack_278 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_280 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_270 = "case0495";
  local_268 = case0496;
  uStack_260 = 0;
  pcStack_250 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_258 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_248 = "case0496";
  local_240 = case0497;
  uStack_238 = 0;
  pcStack_228 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_230 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_220 = "case0497";
  local_218 = case0498;
  uStack_210 = 0;
  pcStack_200 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_208 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_1f8 = "case0498";
  local_1f0 = case0499;
  uStack_1e8 = 0;
  pcStack_1d8 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_1e0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_1d0 = "case0499";
  local_1c8 = case0500;
  uStack_1c0 = 0;
  pcStack_1b0 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_1b8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_1a8 = "case0500";
  local_1a0 = case0501;
  uStack_198 = 0;
  pcStack_188 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_190 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_180 = "case0501";
  local_178 = case0502;
  uStack_170 = 0;
  pcStack_160 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_168 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_158 = "case0502";
  local_150 = case0503;
  uStack_148 = 0;
  pcStack_138 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_140 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_130 = "case0503";
  local_128 = case0504;
  uStack_120 = 0;
  pcStack_110 = std::
                _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
                ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_108 = "case0504";
  local_100 = case0505;
  uStack_f8 = 0;
  pcStack_e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_f0 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_e0 = "case0505";
  local_d8 = case0506;
  uStack_d0 = 0;
  pcStack_c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_b8 = "case0506";
  local_b0 = case0507;
  uStack_a8 = 0;
  pcStack_98 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_90 = "case0507";
  local_88 = case0508;
  uStack_80 = 0;
  pcStack_70 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_68 = "case0508";
  local_60 = case0509;
  uStack_58 = 0;
  pcStack_48 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_40 = "case0509";
  __l._M_len = 0x10e;
  __l._M_array = (iterator)local_2a68;
  std::
  vector<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>
  ::vector(&this->tests_,__l,local_2a71);
  lVar2 = -0x2a30;
  ppcVar1 = &local_60;
  do {
    if (ppcVar1[2] != (code *)0x0) {
      (*ppcVar1[2])(ppcVar1,ppcVar1,3);
    }
    ppcVar1 = ppcVar1 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  return;
}

Assistant:

SemanticModelTester(TestSuite* suite) : Tester(suite) {}